

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::internal::String::Compare(String *this,String *rhs)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  uint local_64;
  size_t local_58;
  size_t local_40;
  size_t i;
  size_t shorter_str_len;
  char *rhs_c_str;
  char *lhs_c_str;
  String *rhs_local;
  String *this_local;
  
  pcVar1 = c_str(this);
  pcVar2 = c_str(rhs);
  if (pcVar1 == (char *)0x0) {
    this_local._4_4_ = 0xffffffff;
    if (pcVar2 == (char *)0x0) {
      this_local._4_4_ = 0;
    }
  }
  else if (pcVar2 == (char *)0x0) {
    this_local._4_4_ = 1;
  }
  else {
    sVar3 = length(this);
    sVar4 = length(rhs);
    if (sVar4 < sVar3) {
      local_58 = length(rhs);
    }
    else {
      local_58 = length(this);
    }
    for (local_40 = 0; local_40 != local_58; local_40 = local_40 + 1) {
      if (pcVar1[local_40] < pcVar2[local_40]) {
        return -1;
      }
      if (pcVar2[local_40] < pcVar1[local_40]) {
        return 1;
      }
    }
    sVar3 = length(this);
    sVar4 = length(rhs);
    if (sVar3 < sVar4) {
      local_64 = 0xffffffff;
    }
    else {
      sVar3 = length(this);
      sVar4 = length(rhs);
      local_64 = (uint)(sVar4 < sVar3);
    }
    this_local._4_4_ = local_64;
  }
  return this_local._4_4_;
}

Assistant:

int String::Compare(const String & rhs) const {
  const char* const lhs_c_str = c_str();
  const char* const rhs_c_str = rhs.c_str();

  if (lhs_c_str == NULL) {
    return rhs_c_str == NULL ? 0 : -1;  // NULL < anything except NULL
  } else if (rhs_c_str == NULL) {
    return 1;
  }

  const size_t shorter_str_len =
      length() <= rhs.length() ? length() : rhs.length();
  for (size_t i = 0; i != shorter_str_len; i++) {
    if (lhs_c_str[i] < rhs_c_str[i]) {
      return -1;
    } else if (lhs_c_str[i] > rhs_c_str[i]) {
      return 1;
    }
  }
  return (length() < rhs.length()) ? -1 :
      (length() > rhs.length()) ? 1 : 0;
}